

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS ref_mpi_allminwho(REF_MPI ref_mpi,REF_DBL *val,REF_INT *who,REF_INT n)

{
  REF_INT RVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar7;
  
  auVar2 = _DAT_0020f5d0;
  if (0 < n && ref_mpi->n < 2) {
    RVar1 = ref_mpi->id;
    lVar3 = (ulong)(uint)n - 1;
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar4 = auVar4 ^ _DAT_0020f5d0;
    auVar6 = _DAT_0020f5b0;
    auVar8 = _DAT_0020f5c0;
    do {
      auVar9 = auVar8 ^ auVar2;
      iVar5 = auVar4._4_4_;
      if ((bool)(~(auVar9._4_4_ == iVar5 && auVar4._0_4_ < auVar9._0_4_ || iVar5 < auVar9._4_4_) & 1
                )) {
        *(REF_INT *)((long)who + lVar3) = RVar1;
      }
      if ((auVar9._12_4_ != auVar4._12_4_ || auVar9._8_4_ <= auVar4._8_4_) &&
          auVar9._12_4_ <= auVar4._12_4_) {
        *(REF_INT *)((long)who + lVar3 + 4) = RVar1;
      }
      auVar9 = auVar6 ^ auVar2;
      iVar10 = auVar9._4_4_;
      if (iVar10 <= iVar5 && (iVar10 != iVar5 || auVar9._0_4_ <= auVar4._0_4_)) {
        *(REF_INT *)((long)who + lVar3 + 8) = RVar1;
        *(REF_INT *)((long)who + lVar3 + 0xc) = RVar1;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar7 + 4;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar7 + 4;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(n + 3U >> 2) << 4 != lVar3);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allminwho(REF_MPI ref_mpi, REF_DBL *val,
                                     REF_INT *who, REF_INT n) {
  REF_INT i;
  if (!ref_mpi_para(ref_mpi)) {
    for (i = 0; i < n; i++) who[i] = ref_mpi_rank(ref_mpi);
    return REF_SUCCESS;
  }
#ifdef HAVE_MPI
  {
    typedef struct REF_MPI_DBLWHO REF_MPI_DBLWHO;
    struct REF_MPI_DBLWHO {
      double val;
      int rank;
    };
    REF_MPI_DBLWHO *in, *out;
    ref_malloc(in, n, REF_MPI_DBLWHO);
    ref_malloc(out, n, REF_MPI_DBLWHO);

    for (i = 0; i < n; i++) {
      in[i].val = val[i];
      in[i].rank = ref_mpi_rank(ref_mpi);
    }
    ref_mpi_where_am_i(ref_mpi);
    if (ref_mpi_debugging(ref_mpi)) printf("MPI_MINLOC %d\n", n);
    MPI_Allreduce(in, out, n, MPI_DOUBLE_INT, MPI_MINLOC,
                  ref_mpi_comm(ref_mpi));
    for (i = 0; i < n; i++) {
      val[i] = out[i].val;
      who[i] = out[i].rank;
    }

    ref_free(out);
    ref_free(in);
  }
#else
  SUPRESS_UNUSED_COMPILER_WARNING(val);
#endif
  return REF_SUCCESS;
}